

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O3

_Bool xdr_naccepted_reply(XDR *xdrs,accepted_reply *ar)

{
  opaque_auth *poVar1;
  u_int *puVar2;
  anon_union_16_2_bec63a44_for_ru *paVar3;
  xdr_op xVar4;
  _Bool _Var5;
  accept_stat aVar6;
  uint *puVar7;
  uint *puVar8;
  undefined8 uVar9;
  char *pcVar10;
  char *pcVar11;
  rpcvers_t *prVar12;
  uint uVar13;
  char local_30 [8];
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x4e,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  if (ar == (accepted_reply *)0x0) {
    __assert_fail("ar != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x4f,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  xVar4 = xdrs->x_op;
  if (xVar4 == XDR_FREE) {
LAB_00110c7d:
    aVar6 = ar->ar_stat;
  }
  else {
    poVar1 = &ar->ar_verf;
    if (xVar4 == XDR_DECODE) {
      puVar8 = (uint *)(xdrs->x_v).vio_tail;
      puVar7 = (uint *)((long)xdrs->x_data + 4);
      if (puVar8 < puVar7) {
        _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)poVar1);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR oa_flavor";
          pcVar10 = "xdr_opaque_auth_decode";
          uVar9 = 0x87;
          goto LAB_00110c5e;
        }
        puVar7 = (uint *)xdrs->x_data;
        puVar8 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar13 = *(uint *)xdrs->x_data;
        poVar1->oa_flavor =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      puVar2 = &(ar->ar_verf).oa_length;
      if (puVar8 < puVar7 + 1) {
        _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar2);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR oa_length";
          pcVar10 = "xdr_opaque_auth_decode";
          uVar9 = 0x8c;
          goto LAB_00110c5e;
        }
        uVar13 = *puVar2;
      }
      else {
        uVar13 = *puVar7;
        uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        *puVar2 = uVar13;
        xdrs->x_data = (uint8_t *)(puVar7 + 1);
      }
      if (uVar13 != 0) {
        if (400 < uVar13) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "xdr_opaque_auth_decode_it";
          uVar9 = 0x70;
LAB_00110a7f:
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR oa_length (%u) > %u",pcVar10,uVar9,(ulong)uVar13,400);
          return false;
        }
        _Var5 = (*xdrs->x_ops->x_getbytes)(xdrs,(ar->ar_verf).oa_body,uVar13);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR opaque";
          pcVar10 = "xdr_opaque_decode";
          uVar9 = 0x1b9;
LAB_00110c5e:
          (*__ntirpc_pkg_params.warnx_)(pcVar11,pcVar10,uVar9);
          return false;
        }
        if (((uVar13 & 3) != 0) &&
           (_Var5 = (*xdrs->x_ops->x_getbytes)(xdrs,local_30 + 4,4 - (uVar13 & 3)), !_Var5)) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR crud";
          pcVar10 = "xdr_opaque_decode";
          uVar9 = 0x1c9;
LAB_00110d81:
          (*__ntirpc_pkg_params.warnx_)(pcVar11,pcVar10,uVar9);
          return false;
        }
      }
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR xdrs->x_op (%u)","xdr_opaque_auth",0xa7);
        return false;
      }
      uVar13 = poVar1->oa_flavor;
      puVar8 = (uint *)(xdrs->x_v).vio_wrap;
      puVar7 = (uint *)((long)xdrs->x_data + 4);
      if (puVar8 < puVar7) {
        _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR oa_flavor";
          pcVar10 = "xdr_opaque_auth_encode";
          uVar9 = 0x55;
          goto LAB_00110c5e;
        }
        puVar7 = (uint *)xdrs->x_data;
        puVar8 = (uint *)(xdrs->x_v).vio_wrap;
      }
      else {
        *(uint *)xdrs->x_data =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      uVar13 = (ar->ar_verf).oa_length;
      if (puVar8 < puVar7 + 1) {
        _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR oa_length";
          pcVar10 = "xdr_opaque_auth_encode";
          uVar9 = 0x5b;
          goto LAB_00110c5e;
        }
      }
      else {
        *puVar7 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                  uVar13 << 0x18;
        xdrs->x_data = (uint8_t *)(puVar7 + 1);
      }
      uVar13 = (ar->ar_verf).oa_length;
      if (uVar13 != 0) {
        if (400 < uVar13) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "xdr_opaque_auth_encode_it";
          uVar9 = 0x3f;
          goto LAB_00110a7f;
        }
        _Var5 = (*xdrs->x_ops->x_putbytes)(xdrs,(ar->ar_verf).oa_body,uVar13);
        if (!_Var5) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar11 = "%s:%u ERROR opaque";
          pcVar10 = "xdr_opaque_encode";
          uVar9 = 0x1e8;
          goto LAB_00110c5e;
        }
        if ((uVar13 & 3) != 0) {
          local_30[0] = '\0';
          local_30[1] = '\0';
          local_30[2] = '\0';
          local_30[3] = '\0';
          _Var5 = (*xdrs->x_ops->x_putbytes)(xdrs,local_30,4 - (uVar13 & 3));
          if (!_Var5) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar11 = "%s:%u ERROR zero";
            pcVar10 = "xdr_opaque_encode";
            uVar9 = 0x1f8;
            goto LAB_00110d81;
          }
        }
      }
    }
    xVar4 = xdrs->x_op;
    if (xVar4 == XDR_FREE) goto LAB_00110c7d;
    if (xVar4 != XDR_DECODE) {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      aVar6 = ar->ar_stat;
      puVar7 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar7) {
        _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,aVar6);
        goto LAB_00110c09;
      }
      *(accept_stat *)xdrs->x_data =
           aVar6 >> 0x18 | (aVar6 & 0xff0000) >> 8 | (aVar6 & 0xff00) << 8 | aVar6 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
      goto LAB_00110c7d;
    }
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar7) {
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,&ar->ar_stat);
LAB_00110c09:
      if (_Var5 == false) {
        return false;
      }
      goto LAB_00110c7d;
    }
    uVar13 = *(uint *)xdrs->x_data;
    aVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    ar->ar_stat = aVar6;
    xdrs->x_data = (uint8_t *)puVar7;
  }
  if (aVar6 != PROG_MISMATCH) {
    if (aVar6 == SUCCESS) {
      _Var5 = (*(ar->ru).AR_results.proc)(xdrs,(ar->ru).AR_results.where);
      return _Var5;
    }
    return true;
  }
  paVar3 = &ar->ru;
  xVar4 = xdrs->x_op;
  if (xVar4 == XDR_ENCODE) {
    uVar13 = (paVar3->AR_versions).low;
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if (puVar7 <= (xdrs->x_v).vio_wrap) {
      *(uint *)xdrs->x_data =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
      goto LAB_00110d10;
    }
    _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
  }
  else {
    if (xVar4 != XDR_DECODE) {
      if (xVar4 != XDR_FREE) {
        return false;
      }
      return true;
    }
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if (puVar7 <= (xdrs->x_v).vio_tail) {
      uVar13 = *(uint *)xdrs->x_data;
      (paVar3->AR_versions).low =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
      goto LAB_00110d10;
    }
    _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar3);
  }
  if (_Var5 == false) {
    return false;
  }
LAB_00110d10:
  xVar4 = xdrs->x_op;
  if (xVar4 == XDR_FREE) {
    return true;
  }
  prVar12 = &(ar->ru).AR_versions.high;
  if (xVar4 == XDR_DECODE) {
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if (puVar7 <= (xdrs->x_v).vio_tail) {
      uVar13 = *(uint *)xdrs->x_data;
      *prVar12 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar7;
      return true;
    }
    _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,prVar12);
    return _Var5;
  }
  if (xVar4 != XDR_ENCODE) {
    return false;
  }
  uVar13 = *prVar12;
  puVar7 = (uint *)((long)xdrs->x_data + 4);
  if (puVar7 <= (xdrs->x_v).vio_wrap) {
    *(uint *)xdrs->x_data =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    xdrs->x_data = (uint8_t *)puVar7;
    return true;
  }
  _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar13);
  return _Var5;
}

Assistant:

bool
xdr_naccepted_reply(XDR *xdrs, struct accepted_reply *ar)
{
	assert(xdrs != NULL);
	assert(ar != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!xdr_opaque_auth(xdrs, &(ar->ar_verf)))
		return (false);
	if (!inline_xdr_enum(xdrs, (enum_t *) &(ar->ar_stat)))
		return (false);
	switch (ar->ar_stat) {

	case SUCCESS:
		return ((*(ar->ar_results.proc)) (xdrs, ar->ar_results.where));

	case PROG_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.high)));

	case GARBAGE_ARGS:
	case SYSTEM_ERR:
	case PROC_UNAVAIL:
	case PROG_UNAVAIL:
		break;
	}
	return (true);		/* true => open ended set of problems */
}